

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O2

BigNumber * operator-(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2)

{
  uint *__args;
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BigNumber::BigNumber
            (__return_storage_ptr__,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48
             ,nb2->m_base);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  bVar5 = operator>(nb1,nb2);
  if (bVar5) {
    uVar7 = 0;
    uVar10 = 0;
    while( true ) {
      uVar11 = (ulong)uVar10;
      puVar3 = (nb1->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(nb1->super_Polynome).m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3 >> 2;
      puVar4 = (nb2->super_Polynome).m_coef.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (long)(nb2->super_Polynome).m_coef.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
      uVar8 = uVar9;
      if (uVar9 < uVar6) {
        uVar8 = uVar6;
      }
      if (uVar8 <= uVar11) break;
      if (uVar11 < uVar6) {
        __args = puVar3 + uVar11;
        if (uVar11 < uVar9) {
          uVar1 = puVar3[uVar11];
          uVar2 = puVar4[uVar11];
          if (uVar1 < uVar2) {
            local_50 = nb1->m_base - ((ulong)uVar7 + (ulong)uVar2);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__
                       ,&local_50);
            puVar3 = (__return_storage_ptr__->super_Polynome).m_coef.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar11;
            *puVar3 = *puVar3 + (nb1->super_Polynome).m_coef.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar11];
LAB_00102d7f:
            uVar7 = 1;
          }
          else if ((uVar7 == 0) || (nb2->m_base - (ulong)uVar2 != 1)) {
            if (uVar1 != uVar2) {
              local_50 = CONCAT44(local_50._4_4_,uVar1 - (uVar7 + uVar2));
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,(uint *)&local_50);
              goto LAB_00102d97;
            }
            if (uVar1 == 0) {
              local_50 = (ulong)local_50._4_4_ << 0x20;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,(int *)&local_50);
            }
            else {
              local_50 = (nb1->m_base - 1) * (ulong)uVar7;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         __return_storage_ptr__,&local_50);
            }
          }
          else {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                       __args);
            uVar7 = 1;
          }
        }
        else if (uVar7 == 0) {
          uVar7 = 0;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     __args);
        }
        else {
          if (*__args == 0) {
            local_50 = nb1->m_base - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_long>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__
                       ,&local_50);
            goto LAB_00102d7f;
          }
          local_50 = CONCAT44(local_50._4_4_,*__args - 1);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__return_storage_ptr__,
                     (uint *)&local_50);
LAB_00102d97:
          uVar7 = 0;
        }
      }
      uVar10 = uVar10 + 1;
    }
    BigNumber::m_format(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber operator - (BigNumber nb1, BigNumber nb2) {
    /*
     * TODO : A refaire ^^
     */
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    BigNumber tmp ({}, nb2.m_base);
    int retenue = 0;
    if(nb1 > nb2) {
        for (unsigned int i = 0; i < max(nb1.m_coef.size(), nb2.m_coef.size()); i++) {
            if (i < nb1.m_coef.size() && i < nb2.m_coef.size()) {
                if (nb1.m_coef[i] >= nb2.m_coef[i]) {
                    if (retenue && nb2.m_base - nb2.m_coef[i] == 1) {
                        tmp.m_coef.emplace_back(nb1.m_coef[i]);
                        retenue = 1;
                    } else {
                        if (nb1.m_coef[i] != nb2.m_coef[i]) {
                            tmp.m_coef.emplace_back(nb1.m_coef[i] - nb2.m_coef[i] - retenue);
                            retenue = 0;
                        } else if (nb1.m_coef[i] == 0) {
                            tmp.m_coef.emplace_back(0);
                        } else {
                            tmp.m_coef.emplace_back(nb1.m_base * retenue - retenue);
                        }

                    }

                } else {
                    tmp.m_coef.emplace_back(nb1.m_base - nb2.m_coef[i] - retenue);
                    tmp.m_coef[i] += nb1.m_coef[i];
                    retenue = 1;
                }
            } else if (i < nb1.m_coef.size()) {
                if (retenue == 0) {
                    tmp.m_coef.emplace_back(nb1.m_coef[i]);
                } else {
                    if (nb1.m_coef[i] == 0) {
                        tmp.m_coef.emplace_back(nb1.m_base - 1);
                    } else {
                        tmp.m_coef.emplace_back(nb1.m_coef[i] - 1);
                        retenue = 0;
                    }
                }

            }
        }
        tmp.m_format();
    }


//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << " Soustraction : " << t_tmp << endl;
    return tmp;
}